

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O1

type_of_iterator * __thiscall
roaring::Roaring64MapSetBitBiDirectionalIterator::operator--
          (Roaring64MapSetBitBiDirectionalIterator *this)

{
  _Rb_tree_node_base *p_Var1;
  _Base_ptr p_Var2;
  
  p_Var1 = (this->map_iter)._M_node;
  if ((_Rb_tree_header *)p_Var1 == &(this->p->_M_t)._M_impl.super__Rb_tree_header) {
    p_Var2 = (_Base_ptr)std::_Rb_tree_decrement(p_Var1);
    (this->map_iter)._M_node = p_Var2;
    roaring_iterator_init_last
              ((roaring_bitmap_t *)&p_Var2[1]._M_parent,(roaring_uint32_iterator_t *)&this->i);
    if ((this->i).has_value != false) {
      return this;
    }
  }
  roaring_uint32_iterator_previous((roaring_uint32_iterator_t *)&this->i);
  if ((this->i).has_value == false) {
    do {
      p_Var1 = (this->map_iter)._M_node;
      if (p_Var1 == (this->p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
        return this;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_decrement(p_Var1);
      (this->map_iter)._M_node = p_Var2;
      roaring_iterator_init_last
                ((roaring_bitmap_t *)&p_Var2[1]._M_parent,(roaring_uint32_iterator_t *)&this->i);
    } while ((this->i).has_value != true);
  }
  return this;
}

Assistant:

type_of_iterator &operator--() {  //  --i, must return dec.value
        if (map_iter == p->cend()) {
            --map_iter;
            roaring_iterator_init_last(&map_iter->second.roaring, &i);
            if (i.has_value) return *this;
        }

        roaring_uint32_iterator_previous(&i);
        while (!i.has_value) {
            if (map_iter == p->cbegin()) return *this;
            map_iter--;
            roaring_iterator_init_last(&map_iter->second.roaring, &i);
        }
        return *this;
    }